

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugManager.cpp
# Opt level: O0

void __thiscall AutoSetDispatchHaltFlag::~AutoSetDispatchHaltFlag(AutoSetDispatchHaltFlag *this)

{
  code *pcVar1;
  bool bVar2;
  DebugManager *pDVar3;
  undefined4 *puVar4;
  DebugContext *pDVar5;
  ProbeContainer *pPVar6;
  AutoSetDispatchHaltFlag *this_local;
  
  pDVar3 = ThreadContext::GetDebugManager(this->m_threadContext);
  bVar2 = Js::DebugManager::IsAtDispatchHalt(pDVar3);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugManager.cpp"
                       ,0xe6,"(m_threadContext->GetDebugManager()->IsAtDispatchHalt())",
                       "m_threadContext->GetDebugManager()->IsAtDispatchHalt()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pDVar3 = ThreadContext::GetDebugManager(this->m_threadContext);
  Js::DebugManager::SetDispatchHalt(pDVar3,false);
  pDVar5 = Js::ScriptContext::GetDebugContext(this->m_scriptContext);
  pPVar6 = Js::DebugContext::GetProbeContainer(pDVar5);
  bVar2 = Js::ProbeContainer::IsPrimaryBrokenToDebuggerContext(pPVar6);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugManager.cpp"
                       ,0xe9,
                       "(m_scriptContext->GetDebugContext()->GetProbeContainer()->IsPrimaryBrokenToDebuggerContext())"
                       ,
                       "m_scriptContext->GetDebugContext()->GetProbeContainer()->IsPrimaryBrokenToDebuggerContext()"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pDVar5 = Js::ScriptContext::GetDebugContext(this->m_scriptContext);
  pPVar6 = Js::DebugContext::GetProbeContainer(pDVar5);
  Js::ProbeContainer::SetIsPrimaryBrokenToDebuggerContext(pPVar6,false);
  return;
}

Assistant:

AutoSetDispatchHaltFlag::~AutoSetDispatchHaltFlag()
{
    Assert(m_threadContext->GetDebugManager()->IsAtDispatchHalt());
    m_threadContext->GetDebugManager()->SetDispatchHalt(false);

    Assert(m_scriptContext->GetDebugContext()->GetProbeContainer()->IsPrimaryBrokenToDebuggerContext());
    m_scriptContext->GetDebugContext()->GetProbeContainer()->SetIsPrimaryBrokenToDebuggerContext(false);
}